

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool matchit::impl::
     PatternTraits<matchit::impl::Or<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>,matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>>
     ::
     matchPatternImpl<mathiu::impl::Power_const&,matchit::impl::Context<bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::Power_const*,bool,bool,mathiu::impl::Log_const*,bool,bool,mathiu::impl::Sin_const*,bool,bool,mathiu::impl::Arctan_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
               (Power *value,
               Or<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *orPat,int32_t depth,
               Context<bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::Power_*,_bool,_bool,_const_mathiu::impl::Log_*,_bool,_bool,_const_mathiu::impl::Sin_*,_bool,_bool,_const_mathiu::impl::Arctan_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
               *context)

{
  Or<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *value_00;
  type tVar1;
  tuple<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *ptVar2;
  __tuple_element_t<1UL,_tuple<Ds<shared_ptr<const_Expr>,_Wildcard>,_Ds<Wildcard,_shared_ptr<const_Expr>_>_>_>
  *pattern;
  enable_if_t<_isTupleLikeV<const_mathiu::impl::Power_&>_&&_isRangeV<const_mathiu::impl::Power_&>,_bool>
  local_51;
  tuple<const_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>_&>
  local_50;
  anon_class_24_3_d2195f94 local_48;
  undefined8 local_30;
  unsigned_long patSize;
  Context<bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::Power_*,_bool,_bool,_const_mathiu::impl::Log_*,_bool,_bool,_const_mathiu::impl::Sin_*,_bool,_bool,_const_mathiu::impl::Arctan_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
  *context_local;
  Or<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *pOStack_18;
  int32_t depth_local;
  Or<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *orPat_local;
  Power *value_local;
  
  local_30 = 2;
  local_48.value = value;
  local_48.depth = depth;
  local_48.context = context;
  patSize = (unsigned_long)context;
  context_local._4_4_ = depth;
  pOStack_18 = orPat;
  orPat_local = (Or<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)value;
  ptVar2 = Or<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
           ::patterns(orPat);
  take<1ul,std::tuple<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>,matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>const&>
            ((impl *)&local_50,ptVar2);
  tVar1 = std::
          apply<matchit::impl::PatternTraits<matchit::impl::Or<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>,matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>>::matchPatternImpl<mathiu::impl::Power_const&,matchit::impl::Context<bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::Power_const*,bool,bool,mathiu::impl::Log_const*,bool,bool,mathiu::impl::Sin_const*,bool,bool,mathiu::impl::Arctan_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>(mathiu::impl::Power_const&,matchit::impl::Or<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>,matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>const&,int,matchit::impl::Context<bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::Power_const*,bool,bool,mathiu::impl::Log_const*,bool,bool,mathiu::impl::Sin_const*,bool,bool,mathiu::impl::Arctan_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>&)::_lambda((auto:1_const&)___)_1_,std::tuple<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>const&>>
                    (&local_48,&local_50);
  value_00 = orPat_local;
  local_51 = true;
  if (!tVar1) {
    ptVar2 = Or<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
             ::patterns(pOStack_18);
    pattern = std::
              get<1ul,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>,matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>
                        (ptVar2);
    local_51 = matchPattern<mathiu::impl::Power_const&,matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Context<bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::Power_const*,bool,bool,mathiu::impl::Log_const*,bool,bool,mathiu::impl::Sin_const*,bool,bool,mathiu::impl::Arctan_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                         ((Power *)value_00,pattern,context_local._4_4_ + 1,
                          (Context<bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::Power_*,_bool,_bool,_const_mathiu::impl::Log_*,_bool,_bool,_const_mathiu::impl::Sin_*,_bool,_bool,_const_mathiu::impl::Arctan_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                           *)patSize);
  }
  return local_51;
}

Assistant:

constexpr static auto matchPatternImpl(Value &&value,
                                                   Or<Patterns...> const &orPat,
                                                   int32_t depth, ContextT &context)
            {
                constexpr auto patSize = sizeof...(Patterns);
                return std::apply(
                           [&value, depth, &context](auto const &...patterns)
                           {
                               return (matchPattern(value, patterns, depth + 1, context) ||
                                       ...);
                           },
                           take<patSize - 1>(orPat.patterns())) ||
                       matchPattern(std::forward<Value>(value),
                                    get<patSize - 1>(orPat.patterns()), depth + 1, context);
            }